

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O2

void __thiscall POMDPFormatParsing::ParserPOMDPFormat_Spirit::Parse(ParserPOMDPFormat_Spirit *this)

{
  ostream *poVar1;
  E *pEVar2;
  int iVar3;
  CommentBlankorNewLineParser *in_R9;
  bool bVar4;
  allocator<char> local_581;
  iterator_t_fi first_fi;
  iterator_t_fi last_fi;
  CommentBlankorNewLineParser skip_parser;
  string local_530;
  string pf;
  string unparsed;
  iterator_t st;
  iterator_t st2;
  iterator_t last;
  POMDPFileParser pomdpfp;
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  info;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_1c0;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_158;
  iterator_t first;
  type local_88;
  
  MultiAgentDecisionProcess::GetProblemFile_abi_cxx11_
            (&pf,(MultiAgentDecisionProcess *)this->_m_decPOMDPDiscrete);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,pf._M_dataplus._M_p,(allocator<char> *)&info);
  boost::spirit::classic::
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>::
  file_iterator(&first_fi,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  if (first_fi.super_type.m_iterator.m_mem.px == (element_type *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&info);
    poVar1 = std::operator<<((ostream *)
                             &info.stop.super_type.m_iterator.super_type.m_iterator.m_curChar,
                             "Unable to open file: ");
    poVar1 = std::operator<<(poVar1,(string *)&pf);
    std::operator<<(poVar1," !\n");
    pEVar2 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar2,(stringstream *)&info);
    __cxa_throw(pEVar2,&E::typeinfo,E::~E);
  }
  boost::spirit::classic::
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>::make_end
            (&last_fi,&first_fi);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
  ::position_iterator<char_const*>
            ((position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
              *)&first,&first_fi,&last_fi,pf._M_dataplus._M_p);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&last);
  POMDPFileParser::POMDPFileParser(&pomdpfp,this);
  skip_parser.start.super_binary<_2c489508_>.subj.
  super_compressed_pair_imp<boost::spirit::classic::action<comment_cobp::CommentOrBlankParser,_void_(*)(boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>)>,_boost::spirit::classic::action<boost::spirit::classic::eol_parser,_void_(*)(boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>)>,_0>
  .first_.
  super_unary<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::parser<boost::spirit::classic::action<comment_cobp::CommentOrBlankParser,_void_(*)(boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>)>_>_>
  .subj = (subject_embed_t)comment_cobp::commentOrBlankParser_p;
  skip_parser.start.super_binary<_2c489508_>.subj.
  super_compressed_pair_imp<boost::spirit::classic::action<comment_cobp::CommentOrBlankParser,_void_(*)(boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>)>,_boost::spirit::classic::action<boost::spirit::classic::eol_parser,_void_(*)(boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>)>,_0>
  .first_.actor = comment_cbonlp::anon_unknown_1::cbonlp_comment_or_blank;
  skip_parser.start.super_binary<_2c489508_>.subj.
  super_compressed_pair_imp<boost::spirit::classic::action<comment_cobp::CommentOrBlankParser,_void_(*)(boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>)>,_boost::spirit::classic::action<boost::spirit::classic::eol_parser,_void_(*)(boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>)>,_0>
  .second_.actor = comment_cbonlp::anon_unknown_1::cbonlp_eol;
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&st);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&info.stop,&st);
  info.hit = false;
  info.full = false;
  info.length = 0;
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(&st);
  st2.super_type.m_iterator.super_type.m_iterator.m_mem.px = (element_type *)&pomdpfp;
  boost::spirit::classic::impl::phrase_parser<comment_cbonlp::CommentBlankorNewLineParser>::
  parse<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::sequence<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,boost::spirit::classic::optional<boost::spirit::classic::end_parser>>>
            ((parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
              *)&st,(phrase_parser<comment_cbonlp::CommentBlankorNewLineParser> *)&first,&last,&st2,
             (sequence<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::optional<boost::spirit::classic::end_parser>_>
              *)&skip_parser,in_R9);
  boost::spirit::classic::
  parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
  ::operator=(&info,(parse_info<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>_>
                     *)&st);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(&st);
  if (info.full != false) {
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::~position_iterator(&info.stop);
    boost::spirit::classic::
    grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>
    ::~grammar(&pomdpfp.
                super_grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>
              );
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::~position_iterator(&last);
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::~position_iterator(&first);
    boost::detail::shared_count::~shared_count(&last_fi.super_type.m_iterator.m_mem.pn);
    boost::detail::shared_count::~shared_count(&first_fi.super_type.m_iterator.m_mem.pn);
    std::__cxx11::string::~string((string *)&pf);
    return;
  }
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&st,&info.stop);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&st2,&info.stop);
  iVar3 = 199;
  while ((bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4 &&
         ((st2._isend != last._isend ||
          ((last._isend == false &&
           (st2.super_type.m_iterator.super_type.m_iterator.m_curChar !=
            last.super_type.m_iterator.super_type.m_iterator.m_curChar))))))) {
    boost::operator++(&local_88,
                      (iterator_facade<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_const_char,_boost::forward_traversal_tag,_const_char_&,_long>
                       *)&st2,0);
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::~position_iterator(&local_88);
  }
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_158,&st);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_1c0,&st2);
  std::__cxx11::string::
  string<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,void>
            ((string *)&unparsed,&local_158,&local_1c0,&local_581);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(&local_1c0);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(&local_158);
  poVar1 = std::operator<<((ostream *)&std::cout,"stopped at: ");
  poVar1 = POMDPFormatParsing::operator<<(poVar1,&info.stop._pos);
  poVar1 = std::operator<<(poVar1,"-> unparsed : ");
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,(string *)&unparsed);
  std::operator<<(poVar1,"\"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"partial match? hit: \"");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"consumed chars - length: \"");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\"\n");
  pEVar2 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar2,"Parsing failed");
  __cxa_throw(pEVar2,&E::typeinfo,E::~E);
}

Assistant:

void ParserPOMDPFormat_Spirit::Parse()
{
    string pf = GetPOMDPDiscrete()->GetProblemFile();
    const char* pf_c = pf.c_str();
    // Create a file iterator for this file
    iterator_t_fi first_fi(pf_c);
    if (!first_fi)
    {
        stringstream ss; ss << "Unable to open file: "<<pf<<" !\n";
        throw E(ss);
    }
    iterator_t_fi last_fi = first_fi.make_end();// Create an EOF iterator

    iterator_t first( first_fi, last_fi, pf_c );
    iterator_t last;

    POMDPFileParser pomdpfp(this);
    comment_cbonlp::CommentBlankorNewLineParser skip_parser;
    parse_info<iterator_t> info; 
    // Parse
    try{
        // Spirit changed when upgrading from 1.33.1 to 1.34.0:
        // trailing spaces are no longer accepted, which the next line
        // to fail on some problems (those with trailing comments). Adding
        // ">> !end_p" to the grammar works around this problem.
        info = parse(first, last , pomdpfp >> !end_p, skip_parser);
        if (info.full)
        {
            if(DEBUG_POMDP_PARSE) cout << ">>>Parsing succeeded\n";
        }
        else
        {
            iterator_t st = info.stop;
            iterator_t st2 = info.stop;
            for(Index i=1;i<200 && st2 != last ;i++)st2++;
            string unparsed(st, st2);
            cout << "stopped at: " << info.stop.get_position() 
                << "-> unparsed : "<< "\"" << unparsed << "\"\n";
            cout << "partial match? hit: \"" << info.hit << "\"\n";
            cout << "consumed chars - length: \"" << info.length << "\"\n";
            throw E("Parsing failed");
        }
    }    
    catch(E& e)
    {
        e.Print();
    }

    if(DEBUG_POMDP_PARSE)  cout << "-------------------------\n";
    return;
}